

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_test_suite.cpp
# Opt level: O3

void jsonpath_tests(string *fpath)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this;
  selector_type *psVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  uint uVar8;
  result_options options;
  iterator this_00;
  iterator this_01;
  ulong uVar9;
  array_range_type aVar10;
  const_array_range_type cVar11;
  json actual;
  json actual_2;
  string expr;
  AssertionHandler catchAssertionHandler;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  expression;
  json tests;
  fstream is;
  undefined1 local_4b0 [16];
  SourceLineInfo local_4a0;
  undefined1 local_490 [16];
  selector_type *local_480;
  selector_type *local_478;
  selector_type *psStack_470;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ulong local_440;
  undefined1 local_438 [8];
  undefined1 auStack_430 [24];
  _Manager_type local_418;
  undefined1 local_408 [64];
  basic_json_options_common<char> local_3c8;
  undefined1 local_2e8 [8];
  unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_2e0 [7];
  iterator local_2a8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_2a0;
  iterator local_298;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_290 [2];
  StringRef local_270;
  StringRef local_260;
  StringRef local_250;
  basic_istream<char,_std::char_traits<char>_> local_240;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test ",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fpath->_M_dataplus)._M_p,fpath->_M_string_length);
  local_240._vptr_basic_istream._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_240,1);
  std::fstream::fstream(&local_240,(string *)fpath,_S_out|_S_in);
  if (((&local_240.field_0x20)
       [*(long *)(CONCAT71(local_240._vptr_basic_istream._1_7_,local_240._vptr_basic_istream._0_1_)
                 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fpath->_M_dataplus)._M_p,fpath->_M_string_length);
    std::operator<<(poVar3,"\n");
    exit(1);
  }
  memset((basic_json_options<char> *)local_438,0,0x148);
  jsoncons::basic_json_options<char>::basic_json_options((basic_json_options<char> *)local_438);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
            (local_290,&local_240,(basic_json_decode_options<char> *)local_438);
  jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
            ((basic_json_encode_options<char> *)local_408,&PTR_construction_vtable_24__00b2faf8);
  local_438 = (undefined1  [8])&PTR__basic_json_decode_options_00b2fb30;
  local_3c8._vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_decode_options_00b2fb58
  ;
  if (local_418 != (_Manager_type)0x0) {
    (*local_418)((_Any_data *)(auStack_430 + 8),(_Any_data *)(auStack_430 + 8),__destroy_functor);
  }
  jsoncons::basic_json_options_common<char>::~basic_json_options_common(&local_3c8);
  aVar10 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                     (local_290);
  if (aVar10.first_._M_current._M_current != aVar10.last_._M_current._M_current) {
    do {
      local_2a8 = aVar10.last_._M_current;
      this_00 = aVar10.first_._M_current;
      local_438 = (undefined1  [8])&DAT_00000005;
      auStack_430._0_8_ = "given";
      pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
               operator[](this_00._M_current,(string_view_type *)local_438);
      local_438 = (undefined1  [8])&DAT_00000005;
      auStack_430._0_8_ = "cases";
      local_2a0 = this_00._M_current;
      pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
               operator[](this_00._M_current,(string_view_type *)local_438);
      cVar11 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
               array_range(pbVar5);
      if (cVar11.first_._M_current._M_current != cVar11.last_._M_current._M_current) {
        do {
          local_298 = cVar11.last_._M_current;
          this_01 = cVar11.first_._M_current;
          local_438 = (undefined1  [8])0xa;
          auStack_430._0_8_ = "expression";
          this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                 jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[](this_01._M_current,(string_view_type *)local_438);
          jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>(&local_460,this,(allocator<char> *)local_2e8);
          local_438 = (undefined1  [8])&DAT_00000006;
          auStack_430._0_8_ = "nodups";
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_01._M_current,(string_view_type *)local_438);
          if (bVar1) {
            local_2e8 = (undefined1  [8])0x6;
            local_2e0[0]._M_t.
            super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            .
            super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
                  )(__uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    )0x868c9e;
            pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               (this_01._M_current,(string_view_type *)local_2e8);
            bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_bool(pbVar5);
            uVar9 = (ulong)bVar1;
          }
          else {
            uVar9 = 0;
          }
          local_438 = (undefined1  [8])0x4;
          auStack_430._0_8_ = "sort";
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_01._M_current,(string_view_type *)local_438);
          if (bVar1) {
            local_2e8 = (undefined1  [8])0x4;
            local_2e0[0]._M_t.
            super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            .
            super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
                  )(__uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    )0x868ca5;
            pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               (this_01._M_current,(string_view_type *)local_2e8);
            bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_bool(pbVar5);
            uVar8 = (uint)uVar9 + 2;
            if (!bVar1) {
              uVar8 = (uint)uVar9;
            }
            uVar9 = (ulong)uVar8;
          }
          local_490._0_8_ = local_460._M_string_length;
          local_490._8_8_ = local_460._M_dataplus._M_p;
          local_438 = (undefined1  [8])0x0;
          auStack_430._0_8_ = (_func_int **)0x0;
          auStack_430._8_8_ = (void *)0x0;
          jsoncons::jsonpath::
          make_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                      *)local_2e8,(jsonpath *)local_490,(string_view_type *)local_438,
                     (custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)local_460._M_string_length);
          std::
          vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::~vector((vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)local_438);
          local_438 = (undefined1  [8])&DAT_00000006;
          auStack_430._0_8_ = "result";
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_01._M_current,(string_view_type *)local_438);
          options = (result_options)pbVar4;
          if (bVar1) {
            jsoncons::jsonpath::
            jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                        *)local_4b0,(const_reference)local_2e8,options);
            local_438 = (undefined1  [8])&DAT_00000006;
            auStack_430._0_8_ = "result";
            psVar6 = (selector_type *)
                     jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_01._M_current,(string_view_type *)local_438);
            iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    compare((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            local_4b0,
                            (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            psVar6);
            if (iVar2 != 0) {
              local_438 = (undefined1  [8])0x7;
              auStack_430._0_8_ = "comment";
              bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                      contains(this_01._M_current,(string_view_type *)local_438);
              if (bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                local_438 = (undefined1  [8])0x7;
                auStack_430._0_8_ = "comment";
                pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                         ::operator[](this_01._M_current,(string_view_type *)local_438);
                pbVar7 = jsoncons::operator<<
                                   ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                    pbVar5);
                std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input:\n",7)
              ;
              local_438 = (undefined1  [8])pbVar4;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Expression: ",0xc);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_460._M_dataplus._M_p,
                                  local_460._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actual: ",8)
              ;
              local_438 = (undefined1  [8])local_4b0;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Expected: ",10);
              local_438 = (undefined1  [8])psVar6;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
            }
            local_490._0_8_ = "CHECK";
            local_490._8_8_ =
                 (__uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )0x5;
            local_4a0.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
            ;
            local_4a0.line = 0x49;
            Catch::StringRef::StringRef(&local_250,"expected == actual");
            Catch::AssertionHandler::AssertionHandler
                      ((AssertionHandler *)local_438,(StringRef *)local_490,&local_4a0,local_250,
                       ContinueOnFailure);
            local_440 = uVar9;
            iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    compare((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            psVar6,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                    *)local_4b0);
            Catch::StringRef::StringRef((StringRef *)&local_4a0,"==");
            local_490[9] = iVar2 == 0;
            local_490[8] = 1;
            local_490._0_8_ = &PTR_streamReconstructedExpression_00b30630;
            local_478 = (selector_type *)local_4a0.file;
            psStack_470 = (selector_type *)local_4a0.line;
            local_480 = psVar6;
            local_468 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        local_4b0;
            Catch::AssertionHandler::handleExpr
                      ((AssertionHandler *)local_438,(ITransientExpression *)local_490);
            Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
            Catch::AssertionHandler::complete((AssertionHandler *)local_438);
            if ((bool)local_408[10] == false) {
              (*(*(_func_int ***)local_408._16_8_)[0xe])
                        (local_408._16_8_,(AssertionHandler *)local_438);
            }
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_4b0
                      );
          }
          local_438 = (undefined1  [8])0x4;
          auStack_430._0_8_ = "path";
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_01._M_current,(string_view_type *)local_438);
          if (bVar1) {
            jsoncons::jsonpath::
            jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                        *)local_4b0,(const_reference)local_2e8,options);
            local_438 = (undefined1  [8])0x4;
            auStack_430._0_8_ = "path";
            psVar6 = (selector_type *)
                     jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_01._M_current,(string_view_type *)local_438);
            iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    compare((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            local_4b0,
                            (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            psVar6);
            if (iVar2 != 0) {
              local_438 = (undefined1  [8])0x7;
              auStack_430._0_8_ = "comment";
              bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                      contains(this_01._M_current,(string_view_type *)local_438);
              if (bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                local_438 = (undefined1  [8])0x7;
                auStack_430._0_8_ = "comment";
                pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                         ::operator[](this_01._M_current,(string_view_type *)local_438);
                pbVar7 = jsoncons::operator<<
                                   ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                    pbVar5);
                std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input:\n",7)
              ;
              local_438 = (undefined1  [8])pbVar4;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Expression: ",0xc);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_460._M_dataplus._M_p,
                                  local_460._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actual: ",8)
              ;
              local_438 = (undefined1  [8])local_4b0;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Expected: ",10);
              local_438 = (undefined1  [8])psVar6;
              jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430);
              local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
              jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_438,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_json_encode_options<char> *)auStack_430,indent);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
              jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                        ((basic_json_encode_options<char> *)auStack_430,
                         &jsoncons::basic_json_encode_options<char>::VTT);
              jsoncons::basic_json_options_common<char>::~basic_json_options_common
                        ((basic_json_options_common<char> *)(local_408 + 0x18));
            }
            local_490._0_8_ = "CHECK";
            local_490._8_8_ =
                 (__uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )0x5;
            local_4a0.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
            ;
            local_4a0.line = 0x5c;
            Catch::StringRef::StringRef(&local_260,"expected == actual");
            Catch::AssertionHandler::AssertionHandler
                      ((AssertionHandler *)local_438,(StringRef *)local_490,&local_4a0,local_260,
                       ContinueOnFailure);
            iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    compare((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            psVar6,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                    *)local_4b0);
            Catch::StringRef::StringRef((StringRef *)&local_4a0,"==");
            local_490[9] = iVar2 == 0;
            local_490[8] = 1;
            local_490._0_8_ = &PTR_streamReconstructedExpression_00b30630;
            local_478 = (selector_type *)local_4a0.file;
            psStack_470 = (selector_type *)local_4a0.line;
            local_480 = psVar6;
            local_468 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        local_4b0;
            Catch::AssertionHandler::handleExpr
                      ((AssertionHandler *)local_438,(ITransientExpression *)local_490);
            Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
            Catch::AssertionHandler::complete((AssertionHandler *)local_438);
            if ((bool)local_408[10] == false) {
              (*(*(_func_int ***)local_408._16_8_)[0xe])
                        (local_408._16_8_,(AssertionHandler *)local_438);
            }
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_4b0
                      );
          }
          local_438 = (undefined1  [8])&DAT_00000005;
          auStack_430._0_8_ = "error";
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_01._M_current,(string_view_type *)local_438);
          if (bVar1) {
            jsoncons::jsonpath::
            jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                        *)local_490,(const_reference)local_2e8,options);
            local_438 = (undefined1  [8])0x7;
            auStack_430._0_8_ = "comment";
            bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    contains(this_01._M_current,(string_view_type *)local_438);
            if (bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Comment: ",9);
              local_438 = (undefined1  [8])0x7;
              auStack_430._0_8_ = "comment";
              pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                       operator[](this_01._M_current,(string_view_type *)local_438);
              pbVar7 = jsoncons::operator<<
                                 ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,pbVar5)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"\n",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
            local_438 = (undefined1  [8])&DAT_00000005;
            auStack_430._0_8_ = "error";
            pbVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_01._M_current,(string_view_type *)local_438);
            pbVar7 = jsoncons::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,pbVar5);
            std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"\n\n",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input:\n",7);
            local_438 = (undefined1  [8])pbVar4;
            jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                      ((basic_json_encode_options<char> *)auStack_430);
            local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_438
                       ,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                       (basic_json_encode_options<char> *)auStack_430,indent);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
            jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                      ((basic_json_encode_options<char> *)auStack_430,
                       &jsoncons::basic_json_encode_options<char>::VTT);
            jsoncons::basic_json_options_common<char>::~basic_json_options_common
                      ((basic_json_options_common<char> *)(local_408 + 0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Expression: ",0xc);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_460._M_dataplus._M_p,
                                local_460._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actual: ",8);
            local_438 = (undefined1  [8])local_490;
            jsoncons::basic_json_encode_options<char>::basic_json_encode_options
                      ((basic_json_encode_options<char> *)auStack_430);
            local_3c8.neginf_to_str_._M_dataplus._M_p._0_1_ = 1;
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_438
                       ,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                       (basic_json_encode_options<char> *)auStack_430,indent);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
            jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                      ((basic_json_encode_options<char> *)auStack_430,
                       &jsoncons::basic_json_encode_options<char>::VTT);
            jsoncons::basic_json_options_common<char>::~basic_json_options_common
                      ((basic_json_options_common<char> *)(local_408 + 0x18));
            local_4a0.file = "CHECK";
            local_4a0.line = (size_t)&DAT_00000005;
            local_4b0._0_8_ =
                 "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
            ;
            local_4b0._8_8_ =
                 (__uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )0x69;
            Catch::StringRef::StringRef(&local_270,"false");
            Catch::AssertionHandler::AssertionHandler
                      ((AssertionHandler *)local_438,(StringRef *)&local_4a0,
                       (SourceLineInfo *)local_4b0,local_270,ContinueOnFailure);
            local_4a0.file = (char *)((ulong)local_4a0.file & 0xffffffffffffff00);
            Catch::AssertionHandler::handleExpr<bool>
                      ((AssertionHandler *)local_438,(ExprLhs<bool> *)&local_4a0);
            Catch::AssertionHandler::complete((AssertionHandler *)local_438);
            if ((bool)local_408[10] == false) {
              (*(*(_func_int ***)local_408._16_8_)[0xe])
                        (local_408._16_8_,(AssertionHandler *)local_438);
            }
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_490
                      );
          }
          std::
          unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::~unique_ptr(local_2e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          cVar11.last_._M_current = local_298._M_current;
          cVar11.first_._M_current = this_01._M_current + 1;
        } while (this_01._M_current + 1 != local_298._M_current);
      }
      aVar10.last_._M_current = local_2a8._M_current;
      aVar10.first_._M_current = local_2a0 + 1;
    } while (local_2a0 + 1 != local_2a8._M_current);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(local_290);
  std::fstream::~fstream(&local_240);
  return;
}

Assistant:

void jsonpath_tests(const std::string& fpath)
{
    std::cout << "Test " << fpath << '\n';

    std::fstream is(fpath);
    if (!is)
    {
        std::cerr << "Cannot open " << fpath << "\n";
        exit(1);
    }

    json tests = json::parse(is);
    for (const auto& test_group : tests.array_range())
    {
        const json& instance = test_group["given"];

        for (const auto& test_case : test_group["cases"].array_range())
        {
            std::string expr = test_case["expression"].as<std::string>();
            try
            {
                jsonpath::result_options options = jsonpath::result_options();
                if (test_case.contains("nodups") && test_case.at("nodups").as<bool>())
                {
                    options |= jsonpath::result_options::nodups;
                }
                if (test_case.contains("sort") && test_case.at("sort").as<bool>())
                {
                    options |= jsonpath::result_options::sort;
                }
                auto expression = jsoncons::jsonpath::make_expression<json>(expr);
                if (test_case.contains("result"))
                {
                    jsonpath::result_options rflags = options | jsonpath::result_options::value;
                    json actual = expression.evaluate(instance, rflags);
                    const json& expected = test_case["result"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("path"))
                {
                    jsonpath::result_options pflags = options | jsonpath::result_options::path;
                    json actual = expression.evaluate(instance, pflags);
                    const json& expected = test_case["path"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("error"))
                {
                    json actual = expression.evaluate(instance);
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n";
                    }
                    std::cout << "Error: " << test_case["error"] << "\n\n";
                    std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                    CHECK(false);
                }

            }
            catch (const std::exception& e)
            {
                if (test_case.contains("result"))
                {
                    std::cout << e.what() << "\n";
                    const json& expected = test_case["result"];
                    std::cout << e.what() << "\n";
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n\n";
                    }
                    std::cout << "Input\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Expected: " << expected << "\n\n";
                    CHECK(false);
                }
            }
        }
    }
}